

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetaction.cpp
# Opt level: O0

void __thiscall QWidgetAction::~QWidgetAction(QWidgetAction *this)

{
  bool bVar1;
  QWidgetActionPrivate *pQVar2;
  const_iterator o;
  QWidget *pQVar3;
  Object *in_RDI;
  long in_FS_OFFSET;
  QWidget *w;
  add_const_t<QList<QWidget_*>_> *__range1;
  QWidgetActionPrivate *d;
  QList<QWidget_*> widgetsToDelete;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QWidget_*> *in_stack_ffffffffffffff78;
  QList<QWidget_*> *slot;
  Object *signal;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined ***)&in_RDI->super_QtWidgetsActionPrivate = &PTR_metaObject_00d0d290;
  signal = in_RDI;
  pQVar2 = d_func((QWidgetAction *)0x4b09ae);
  slot = &pQVar2->createdWidgets;
  local_10.i = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = QList<QWidget_*>::begin((QList<QWidget_*> *)in_RDI);
  o = QList<QWidget_*>::end((QList<QWidget_*> *)in_RDI);
  while( true ) {
    bVar1 = QList<QWidget_*>::const_iterator::operator!=(&local_10,o);
    if (!bVar1) break;
    QList<QWidget_*>::const_iterator::operator*(&local_10);
    QObjectPrivate::disconnect<void(QObject::*)(QObject*),void(QWidgetActionPrivate::*)(QObject*)>
              ((Object *)QWidgetActionPrivate::widgetDestroyed,(offset_in_QObject_to_subr)signal,
               in_RDI,(Function)slot);
    QList<QWidget_*>::const_iterator::operator++(&local_10);
  }
  QList<QWidget_*>::QList((QList<QWidget_*> *)in_RDI,in_stack_ffffffffffffff78);
  QList<QWidget_*>::clear((QList<QWidget_*> *)in_RDI);
  qDeleteAll<QList<QWidget*>>((QList<QWidget_*> *)in_RDI);
  pQVar3 = ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x4b0afb);
  if (pQVar3 != (QWidget *)0x0) {
    (**(code **)(*(long *)pQVar3 + 0x20))();
  }
  QList<QWidget_*>::~QList((QList<QWidget_*> *)0x4b0b19);
  QAction::~QAction((QAction *)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QWidgetAction::~QWidgetAction()
{
    Q_D(QWidgetAction);
    for (QWidget *w : std::as_const(d->createdWidgets))
        QObjectPrivate::disconnect(w, &QWidget::destroyed,
                                   d, &QWidgetActionPrivate::widgetDestroyed);
    QList<QWidget *> widgetsToDelete = d->createdWidgets;
    d->createdWidgets.clear();
    qDeleteAll(widgetsToDelete);
    delete d->defaultWidget;
}